

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiBufferTests.cpp
# Opt level: O0

void __thiscall
vkt::api::anon_unknown_0::BufferTestInstance::~BufferTestInstance(BufferTestInstance *this)

{
  BufferTestInstance *this_local;
  
  (this->super_TestInstance)._vptr_TestInstance = (_func_int **)&PTR__BufferTestInstance_0165d7f0;
  de::details::
  UniquePtr<vkt::api::(anonymous_namespace)::BufferTestInstance::SparseContext,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::BufferTestInstance::SparseContext>_>
  ::~UniquePtr(&this->m_sparseContext);
  TestInstance::~TestInstance(&this->super_TestInstance);
  return;
}

Assistant:

BufferTestInstance			(Context&				ctx,
															 BufferCaseParameters	testCase)
									: TestInstance		(ctx)
									, m_testCase		(testCase)
									, m_sparseContext	(createSparseContext())
								{}